

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gi.cpp
# Opt level: O1

void __thiscall FMapInfoParser::ParseGameInfo(FMapInfoParser *this)

{
  FName *pFVar1;
  FString __s1;
  bool bVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  size_t sVar6;
  char *pcVar7;
  staticgameborder_t *other;
  FString *this_00;
  ulong uVar8;
  long lVar9;
  FString nextKey;
  FString color;
  FString colorName;
  FString local_48;
  FString local_40;
  FString local_38;
  
  FScanner::MustGetToken(&this->sc,0x7b);
  bVar2 = FScanner::GetToken(&this->sc);
  if (bVar2) {
    iVar3 = (this->sc).TokenType;
    while (iVar3 != 0x7d) {
      FScanner::TokenMustBe(&this->sc,0x101);
      FString::FString(&local_48,(this->sc).String);
      FScanner::MustGetToken(&this->sc,0x3d);
      __s1.Chars = local_48.Chars;
      iVar3 = strcasecmp(local_48.Chars,"weaponslot");
      if (iVar3 == 0) {
        FScanner::MustGetToken(&this->sc,0x104);
        if (9 < (uint)(this->sc).Number) {
          FScanner::ScriptError(&this->sc,"Weapon slot index must be in range [0..9].\n");
        }
        iVar3 = (this->sc).Number;
        if (gameinfo.DefaultWeaponSlots[iVar3].Count != 0) {
          gameinfo.DefaultWeaponSlots[iVar3].Count = 0;
        }
        FScanner::MustGetToken(&this->sc,0x2c);
        do {
          FScanner::MustGetString(&this->sc);
          iVar4 = FName::NameManager::FindName(&FName::NameData,(this->sc).String,false);
          TArray<FName,_FName>::Grow(gameinfo.DefaultWeaponSlots + iVar3,1);
          uVar5 = gameinfo.DefaultWeaponSlots[iVar3].Count;
          gameinfo.DefaultWeaponSlots[iVar3].Array[uVar5].Index = iVar4;
          gameinfo.DefaultWeaponSlots[iVar3].Count = uVar5 + 1;
          bVar2 = FScanner::CheckToken(&this->sc,0x2c);
        } while (bVar2);
      }
      else {
        iVar3 = strcasecmp(__s1.Chars,"border");
        if (iVar3 == 0) {
          bVar2 = FScanner::CheckToken(&this->sc,0x101);
          if (bVar2) {
            iVar3 = FScanner::MustMatchString(&this->sc,GameInfoBorders,8);
            other = &DoomBorder;
            if (iVar3 == 2) {
              other = &StrifeBorder;
            }
            if (iVar3 == 1) {
              other = &HereticBorder;
            }
            gameborder_t::operator=(&gameinfo.Border,other);
          }
          else {
            FScanner::MustGetToken(&this->sc,0x104);
            gameinfo.Border.offset = (BYTE)(this->sc).Number;
            FScanner::MustGetToken(&this->sc,0x2c);
            FScanner::MustGetToken(&this->sc,0x104);
            gameinfo.Border.size = (BYTE)(this->sc).Number;
            lVar9 = 0;
            do {
              FScanner::MustGetToken(&this->sc,0x2c);
              FScanner::MustGetToken(&this->sc,0x102);
              FString::operator=(*(FString **)((long)&DAT_00848490 + lVar9),(this->sc).String);
              lVar9 = lVar9 + 8;
            } while (lVar9 != 0x40);
          }
        }
        else {
          iVar3 = strcasecmp(__s1.Chars,"armoricons");
          if (iVar3 == 0) {
            FScanner::MustGetToken(&this->sc,0x102);
            FString::operator=(&gameinfo.ArmorIcon1,(this->sc).String);
            bVar2 = FScanner::CheckToken(&this->sc,0x2c);
            if (!bVar2) goto LAB_004bb90c;
            FScanner::MustGetToken(&this->sc,0x106);
            gameinfo.Armor2Percent = (this->sc).Float;
            FScanner::MustGetToken(&this->sc,0x2c);
            FScanner::MustGetToken(&this->sc,0x102);
            this_00 = &gameinfo.ArmorIcon2;
          }
          else {
            iVar3 = strcasecmp(__s1.Chars,"maparrow");
            if (iVar3 == 0) {
              FScanner::MustGetToken(&this->sc,0x102);
              FString::operator=(&gameinfo.mMapArrow,(this->sc).String);
              bVar2 = FScanner::CheckToken(&this->sc,0x2c);
              if (!bVar2) {
                FString::operator=(&gameinfo.mCheatMapArrow,(char *)"");
                goto LAB_004bb90c;
              }
              FScanner::MustGetToken(&this->sc,0x102);
              this_00 = &gameinfo.mCheatMapArrow;
            }
            else {
              iVar3 = strcasecmp(__s1.Chars,"cheatKey");
              if (iVar3 == 0) {
                FScanner::MustGetToken(&this->sc,0x102);
                this_00 = &gameinfo.mCheatKey;
              }
              else {
                iVar3 = strcasecmp(__s1.Chars,"easyKey");
                if (iVar3 == 0) {
                  FScanner::MustGetToken(&this->sc,0x102);
                  this_00 = &gameinfo.mEasyKey;
                }
                else {
                  iVar3 = strcasecmp(__s1.Chars,"titlePage");
                  if (iVar3 != 0) {
                    iVar3 = strcasecmp(__s1.Chars,"addcreditPage");
                    if (iVar3 == 0) {
                      do {
                        FScanner::MustGetToken(&this->sc,0x102);
                        sVar6 = strlen((this->sc).String);
                        if (8 < sVar6) {
                          FScanner::ScriptError
                                    (&this->sc,
                                     "Value for \'%s\' can not be longer than %d characters.",
                                     "creditPages",8);
                        }
                        pcVar7 = (this->sc).String;
                        TArray<FName,_FName>::Grow(&gameinfo.creditPages,1);
                        uVar8 = (ulong)gameinfo.creditPages.Count;
                        gameinfo.creditPages.Count = gameinfo.creditPages.Count + 1;
                        if (gameinfo.creditPages.Count != 0) {
                          gameinfo.creditPages.Array[uVar8].Index = 0;
                        }
                        pFVar1 = gameinfo.creditPages.Array;
                        iVar3 = FName::NameManager::FindName(&FName::NameData,pcVar7,false);
                        pFVar1[uVar8].Index = iVar3;
                        bVar2 = FScanner::CheckToken(&this->sc,0x2c);
                      } while (bVar2);
                    }
                    else {
                      iVar3 = strcasecmp(__s1.Chars,"CreditPage");
                      if (iVar3 == 0) {
                        if (gameinfo.creditPages.Count != 0) {
                          gameinfo.creditPages.Count = 0;
                        }
                        do {
                          FScanner::MustGetToken(&this->sc,0x102);
                          sVar6 = strlen((this->sc).String);
                          if (8 < sVar6) {
                            FScanner::ScriptError
                                      (&this->sc,
                                       "Value for \'%s\' can not be longer than %d characters.",
                                       "creditPages",8);
                          }
                          pcVar7 = (this->sc).String;
                          TArray<FName,_FName>::Grow(&gameinfo.creditPages,1);
                          uVar8 = (ulong)gameinfo.creditPages.Count;
                          gameinfo.creditPages.Count = gameinfo.creditPages.Count + 1;
                          if (gameinfo.creditPages.Count != 0) {
                            gameinfo.creditPages.Array[uVar8].Index = 0;
                          }
                          pFVar1 = gameinfo.creditPages.Array;
                          iVar3 = FName::NameManager::FindName(&FName::NameData,pcVar7,false);
                          pFVar1[uVar8].Index = iVar3;
                          bVar2 = FScanner::CheckToken(&this->sc,0x2c);
                        } while (bVar2);
                      }
                      else {
                        iVar3 = strcasecmp(__s1.Chars,"addplayerclasses");
                        if (iVar3 == 0) {
                          do {
                            FScanner::MustGetToken(&this->sc,0x102);
                            pcVar7 = (this->sc).String;
                            TArray<FName,_FName>::Grow(&gameinfo.PlayerClasses,1);
                            uVar8 = (ulong)gameinfo.PlayerClasses.Count;
                            gameinfo.PlayerClasses.Count = gameinfo.PlayerClasses.Count + 1;
                            if (gameinfo.PlayerClasses.Count != 0) {
                              gameinfo.PlayerClasses.Array[uVar8].Index = 0;
                            }
                            pFVar1 = gameinfo.PlayerClasses.Array;
                            iVar3 = FName::NameManager::FindName(&FName::NameData,pcVar7,false);
                            pFVar1[uVar8].Index = iVar3;
                            bVar2 = FScanner::CheckToken(&this->sc,0x2c);
                          } while (bVar2);
                        }
                        else {
                          iVar3 = strcasecmp(__s1.Chars,"playerclasses");
                          if (iVar3 == 0) {
                            if (gameinfo.PlayerClasses.Count != 0) {
                              gameinfo.PlayerClasses.Count = 0;
                            }
                            do {
                              FScanner::MustGetToken(&this->sc,0x102);
                              pcVar7 = (this->sc).String;
                              TArray<FName,_FName>::Grow(&gameinfo.PlayerClasses,1);
                              uVar8 = (ulong)gameinfo.PlayerClasses.Count;
                              gameinfo.PlayerClasses.Count = gameinfo.PlayerClasses.Count + 1;
                              if (gameinfo.PlayerClasses.Count != 0) {
                                gameinfo.PlayerClasses.Array[uVar8].Index = 0;
                              }
                              pFVar1 = gameinfo.PlayerClasses.Array;
                              iVar3 = FName::NameManager::FindName(&FName::NameData,pcVar7,false);
                              pFVar1[uVar8].Index = iVar3;
                              bVar2 = FScanner::CheckToken(&this->sc,0x2c);
                            } while (bVar2);
                          }
                          else {
                            iVar3 = strcasecmp(__s1.Chars,"titleMusic");
                            if (iVar3 == 0) {
                              FScanner::MustGetToken(&this->sc,0x102);
                              gameinfo.titleOrder = 0;
                              pcVar7 = strchr((this->sc).String,0x3a);
                              if (pcVar7 != (char *)0x0) {
                                gameinfo.titleOrder = atoi(pcVar7 + 1);
                                *pcVar7 = '\0';
                              }
                              FString::operator=(&gameinfo.titleMusic,(this->sc).String);
                            }
                            else {
                              iVar3 = strcasecmp(__s1.Chars,"titleTime");
                              if (iVar3 == 0) {
                                FScanner::MustGetFloat(&this->sc);
                                gameinfo.titleTime = (float)(this->sc).Float;
                              }
                              else {
                                iVar3 = strcasecmp(__s1.Chars,"advisoryTime");
                                if (iVar3 == 0) {
                                  FScanner::MustGetFloat(&this->sc);
                                  gameinfo.advisoryTime = (float)(this->sc).Float;
                                }
                                else {
                                  iVar3 = strcasecmp(__s1.Chars,"pageTime");
                                  if (iVar3 == 0) {
                                    FScanner::MustGetFloat(&this->sc);
                                    gameinfo.pageTime = (float)(this->sc).Float;
                                  }
                                  else {
                                    iVar3 = strcasecmp(__s1.Chars,"chatSound");
                                    if (iVar3 == 0) {
                                      FScanner::MustGetToken(&this->sc,0x102);
                                      this_00 = &gameinfo.chatSound;
                                      goto LAB_004bb904;
                                    }
                                    iVar3 = strcasecmp(__s1.Chars,"finaleMusic");
                                    if (iVar3 == 0) {
                                      FScanner::MustGetToken(&this->sc,0x102);
                                      gameinfo.finaleOrder = 0;
                                      pcVar7 = strchr((this->sc).String,0x3a);
                                      if (pcVar7 != (char *)0x0) {
                                        gameinfo.finaleOrder = atoi(pcVar7 + 1);
                                        *pcVar7 = '\0';
                                      }
                                      FString::operator=(&gameinfo.finaleMusic,(this->sc).String);
                                    }
                                    else {
                                      iVar3 = strcasecmp(__s1.Chars,"finaleFlat");
                                      if (iVar3 == 0) {
                                        FScanner::MustGetToken(&this->sc,0x102);
                                        this_00 = &gameinfo.FinaleFlat;
                                        goto LAB_004bb904;
                                      }
                                      iVar3 = strcasecmp(__s1.Chars,"finalePage");
                                      if (iVar3 == 0) {
                                        if (gameinfo.finalePages.Count != 0) {
                                          gameinfo.finalePages.Count = 0;
                                        }
                                        do {
                                          FScanner::MustGetToken(&this->sc,0x102);
                                          sVar6 = strlen((this->sc).String);
                                          if (8 < sVar6) {
                                            FScanner::ScriptError
                                                      (&this->sc,
                                                                                                              
                                                  "Value for \'%s\' can not be longer than %d characters."
                                                  ,"finalePages",8);
                                          }
                                          pcVar7 = (this->sc).String;
                                          TArray<FName,_FName>::Grow(&gameinfo.finalePages,1);
                                          uVar8 = (ulong)gameinfo.finalePages.Count;
                                          gameinfo.finalePages.Count =
                                               gameinfo.finalePages.Count + 1;
                                          if (gameinfo.finalePages.Count != 0) {
                                            gameinfo.finalePages.Array[uVar8].Index = 0;
                                          }
                                          pFVar1 = gameinfo.finalePages.Array;
                                          iVar3 = FName::NameManager::FindName
                                                            (&FName::NameData,pcVar7,false);
                                          pFVar1[uVar8].Index = iVar3;
                                          bVar2 = FScanner::CheckToken(&this->sc,0x2c);
                                        } while (bVar2);
                                      }
                                      else {
                                        iVar3 = strcasecmp(__s1.Chars,"addinfoPage");
                                        if (iVar3 == 0) {
                                          do {
                                            FScanner::MustGetToken(&this->sc,0x102);
                                            sVar6 = strlen((this->sc).String);
                                            if (8 < sVar6) {
                                              FScanner::ScriptError
                                                        (&this->sc,
                                                                                                                  
                                                  "Value for \'%s\' can not be longer than %d characters."
                                                  ,"infoPages",8);
                                            }
                                            pcVar7 = (this->sc).String;
                                            TArray<FName,_FName>::Grow(&gameinfo.infoPages,1);
                                            uVar8 = (ulong)gameinfo.infoPages.Count;
                                            gameinfo.infoPages.Count = gameinfo.infoPages.Count + 1;
                                            if (gameinfo.infoPages.Count != 0) {
                                              gameinfo.infoPages.Array[uVar8].Index = 0;
                                            }
                                            pFVar1 = gameinfo.infoPages.Array;
                                            iVar3 = FName::NameManager::FindName
                                                              (&FName::NameData,pcVar7,false);
                                            pFVar1[uVar8].Index = iVar3;
                                            bVar2 = FScanner::CheckToken(&this->sc,0x2c);
                                          } while (bVar2);
                                        }
                                        else {
                                          iVar3 = strcasecmp(__s1.Chars,"infoPage");
                                          if (iVar3 != 0) {
                                            iVar3 = strcasecmp(__s1.Chars,"pausesign");
                                            if (iVar3 == 0) {
                                              FScanner::MustGetToken(&this->sc,0x102);
                                              this_00 = &gameinfo.PauseSign;
                                            }
                                            else {
                                              iVar3 = strcasecmp(__s1.Chars,"quitSound");
                                              if (iVar3 == 0) {
                                                FScanner::MustGetToken(&this->sc,0x102);
                                                this_00 = &gameinfo.quitSound;
                                              }
                                              else {
                                                iVar3 = strcasecmp(__s1.Chars,"borderFlat");
                                                if (iVar3 != 0) {
                                                  iVar3 = strcasecmp(__s1.Chars,"telefogheight");
                                                  if (iVar3 == 0) {
                                                    FScanner::MustGetFloat(&this->sc);
                                                    gameinfo.telefogheight = (this->sc).Float;
                                                  }
                                                  else {
                                                    iVar3 = strcasecmp(__s1.Chars,"gibfactor");
                                                    if (iVar3 == 0) {
                                                      FScanner::MustGetFloat(&this->sc);
                                                      gameinfo.gibfactor = (this->sc).Float;
                                                    }
                                                    else {
                                                      iVar3 = strcasecmp(__s1.Chars,"defKickback");
                                                      if (iVar3 != 0) {
                                                        iVar3 = strcasecmp(__s1.Chars,"SkyFlatName")
                                                        ;
                                                        if (iVar3 == 0) {
                                                          FScanner::MustGetToken(&this->sc,0x102);
                                                          this_00 = &gameinfo.SkyFlatName;
                                                        }
                                                        else {
                                                          iVar3 = strcasecmp(__s1.Chars,"translator"
                                                                            );
                                                          if (iVar3 != 0) {
                                                            iVar3 = strcasecmp(__s1.Chars,
                                                                               "pickupcolor");
                                                            if (iVar3 == 0) {
                                                              FScanner::MustGetToken
                                                                        (&this->sc,0x102);
                                                              FString::FString(&local_40,
                                                                               (this->sc).String);
                                                              V_GetColorStringByName
                                                                        ((char *)&local_38);
                                                              if (*(int *)(local_38.Chars + -0xc) !=
                                                                  0) {
                                                                FString::operator=(&local_40,
                                                                                   &local_38);
                                                              }
                                                              gameinfo.pickupcolor =
                                                                   V_GetColorFromString
                                                                             ((DWORD *)0x0,
                                                                              local_40.Chars);
                                                            }
                                                            else {
                                                              iVar3 = strcasecmp(__s1.Chars,
                                                                                 "defaultbloodcolor"
                                                                                );
                                                              if (iVar3 == 0) {
                                                                FScanner::MustGetToken
                                                                          (&this->sc,0x102);
                                                                FString::FString(&local_40,
                                                                                 (this->sc).String);
                                                                V_GetColorStringByName
                                                                          ((char *)&local_38);
                                                                if (*(int *)(local_38.Chars + -0xc)
                                                                    != 0) {
                                                                  FString::operator=(&local_40,
                                                                                     &local_38);
                                                                }
                                                                gameinfo.defaultbloodcolor =
                                                                     V_GetColorFromString
                                                                               ((DWORD *)0x0,
                                                                                local_40.Chars);
                                                              }
                                                              else {
                                                                iVar3 = strcasecmp(__s1.Chars,
                                                                                                                                                                      
                                                  "defaultbloodparticlecolor");
                                                  if (iVar3 != 0) {
                                                    iVar3 = strcasecmp(__s1.Chars,"backpacktype");
                                                    if (iVar3 == 0) {
                                                      FScanner::MustGetToken(&this->sc,0x102);
                                                      this_00 = &gameinfo.backpacktype;
                                                    }
                                                    else {
                                                      iVar3 = strcasecmp(__s1.Chars,"statusbar");
                                                      if (iVar3 != 0) {
                                                        iVar3 = strcasecmp(__s1.Chars,
                                                                           "intermissionMusic");
                                                        if (iVar3 == 0) {
                                                          FScanner::MustGetToken(&this->sc,0x102);
                                                          gameinfo.intermissionOrder = 0;
                                                          pcVar7 = strchr((this->sc).String,0x3a);
                                                          if (pcVar7 != (char *)0x0) {
                                                            gameinfo.intermissionOrder =
                                                                 atoi(pcVar7 + 1);
                                                            *pcVar7 = '\0';
                                                          }
                                                          FString::operator=(&gameinfo.
                                                  intermissionMusic,(this->sc).String);
                                                  }
                                                  else {
                                                    iVar3 = strcasecmp(__s1.Chars,"CursorPic");
                                                    if (iVar3 == 0) {
                                                      FScanner::MustGetToken(&this->sc,0x102);
                                                      this_00 = &gameinfo.CursorPic;
                                                      goto LAB_004bb904;
                                                    }
                                                    iVar3 = strcasecmp(__s1.Chars,
                                                                       "noloopfinalemusic");
                                                    if (iVar3 == 0) {
                                                      bVar2 = FScanner::CheckToken(&this->sc,0x14c);
                                                      if (bVar2) {
                                                        gameinfo.noloopfinalemusic = false;
                                                      }
                                                      else {
                                                        FScanner::MustGetToken(&this->sc,0x14b);
                                                        gameinfo.noloopfinalemusic = true;
                                                      }
                                                    }
                                                    else {
                                                      iVar3 = strcasecmp(__s1.Chars,"drawreadthis");
                                                      if (iVar3 == 0) {
                                                        bVar2 = FScanner::CheckToken
                                                                          (&this->sc,0x14c);
                                                        if (bVar2) {
                                                          gameinfo.drawreadthis = false;
                                                        }
                                                        else {
                                                          FScanner::MustGetToken(&this->sc,0x14b);
                                                          gameinfo.drawreadthis = true;
                                                        }
                                                      }
                                                      else {
                                                        iVar3 = strcasecmp(__s1.Chars,"swapmenu");
                                                        if (iVar3 == 0) {
                                                          bVar2 = FScanner::CheckToken
                                                                            (&this->sc,0x14c);
                                                          if (bVar2) {
                                                            gameinfo.swapmenu = false;
                                                          }
                                                          else {
                                                            FScanner::MustGetToken(&this->sc,0x14b);
                                                            gameinfo.swapmenu = true;
                                                          }
                                                        }
                                                        else {
                                                          iVar3 = strcasecmp(__s1.Chars,
                                                                             "dontcrunchcorpses");
                                                          if (iVar3 == 0) {
                                                            bVar2 = FScanner::CheckToken
                                                                              (&this->sc,0x14c);
                                                            if (bVar2) {
                                                              gameinfo.dontcrunchcorpses = false;
                                                            }
                                                            else {
                                                              FScanner::MustGetToken
                                                                        (&this->sc,0x14b);
                                                              gameinfo.dontcrunchcorpses = true;
                                                            }
                                                          }
                                                          else {
                                                            iVar3 = strcasecmp(__s1.Chars,
                                                                               "intermissioncounter"
                                                                              );
                                                            if (iVar3 == 0) {
                                                              bVar2 = FScanner::CheckToken
                                                                                (&this->sc,0x14c);
                                                              if (bVar2) {
                                                                gameinfo.intermissioncounter = false
                                                                ;
                                                              }
                                                              else {
                                                                FScanner::MustGetToken
                                                                          (&this->sc,0x14b);
                                                                gameinfo.intermissioncounter = true;
                                                              }
                                                            }
                                                            else {
                                                              iVar3 = strcasecmp(__s1.Chars,
                                                                                 "nightmarefast");
                                                              if (iVar3 == 0) {
                                                                bVar2 = FScanner::CheckToken
                                                                                  (&this->sc,0x14c);
                                                                if (bVar2) {
                                                                  gameinfo.nightmarefast = false;
                                                                }
                                                                else {
                                                                  FScanner::MustGetToken
                                                                            (&this->sc,0x14b);
                                                                  gameinfo.nightmarefast = true;
                                                                }
                                                              }
                                                              else {
                                                                iVar3 = strcasecmp(__s1.Chars,
                                                                                   "dimcolor");
                                                                if (iVar3 == 0) {
                                                                  FScanner::MustGetToken
                                                                            (&this->sc,0x102);
                                                                  FString::FString(&local_40,
                                                                                   (this->sc).String
                                                                                  );
                                                                  V_GetColorStringByName
                                                                            ((char *)&local_38);
                                                                  if (*(int *)(local_38.Chars + -0xc
                                                                              ) != 0) {
                                                                    FString::operator=(&local_40,
                                                                                       &local_38);
                                                                  }
                                                                  gameinfo.dimcolor =
                                                                       V_GetColorFromString
                                                                                 ((DWORD *)0x0,
                                                                                  local_40.Chars);
                                                                  goto LAB_004bbf86;
                                                                }
                                                                iVar3 = strcasecmp(__s1.Chars,
                                                                                   "dimamount");
                                                                if (iVar3 == 0) {
                                                                  FScanner::MustGetFloat(&this->sc);
                                                                  gameinfo.dimamount =
                                                                       (float)(this->sc).Float;
                                                                }
                                                                else {
                                                                  iVar3 = strcasecmp(__s1.Chars,
                                                                                                                                                                          
                                                  "definventorymaxamount");
                                                  if (iVar3 == 0) {
                                                    FScanner::MustGetNumber(&this->sc);
                                                    gameinfo.definventorymaxamount =
                                                         (this->sc).Number;
                                                  }
                                                  else {
                                                    iVar3 = strcasecmp(__s1.Chars,
                                                                       "defaultrespawntime");
                                                    if (iVar3 == 0) {
                                                      FScanner::MustGetNumber(&this->sc);
                                                      gameinfo.defaultrespawntime =
                                                           (this->sc).Number;
                                                    }
                                                    else {
                                                      iVar3 = strcasecmp(__s1.Chars,
                                                                         "defaultdropstyle");
                                                      if (iVar3 == 0) {
                                                        FScanner::MustGetNumber(&this->sc);
                                                        gameinfo.defaultdropstyle =
                                                             (this->sc).Number;
                                                      }
                                                      else {
                                                        iVar3 = strcasecmp(__s1.Chars,"endoom");
                                                        if (iVar3 == 0) {
                                                          FScanner::MustGetToken(&this->sc,0x102);
                                                          this_00 = &gameinfo.Endoom;
                                                          goto LAB_004bb904;
                                                        }
                                                        iVar3 = strcasecmp(__s1.Chars,
                                                                           "addquitmessages");
                                                        if (iVar3 == 0) {
                                                          do {
                                                            FScanner::MustGetToken(&this->sc,0x102);
                                                            pcVar7 = (this->sc).String;
                                                            uVar5 = TArray<FString,_FString>::
                                                                    Reserve(&gameinfo.quitmessages,1
                                                                           );
                                                            FString::operator=(gameinfo.quitmessages
                                                                               .Array + uVar5,pcVar7
                                                                              );
                                                            bVar2 = FScanner::CheckToken
                                                                              (&this->sc,0x2c);
                                                          } while (bVar2);
                                                        }
                                                        else {
                                                          iVar3 = strcasecmp(__s1.Chars,
                                                                             "quitmessages");
                                                          if (iVar3 == 0) {
                                                            if (gameinfo.quitmessages.Count != 0) {
                                                              TArray<FString,_FString>::DoDelete
                                                                        (&gameinfo.quitmessages,0,
                                                                         gameinfo.quitmessages.Count
                                                                         - 1);
                                                              gameinfo.quitmessages.Count = 0;
                                                            }
                                                            do {
                                                              FScanner::MustGetToken
                                                                        (&this->sc,0x102);
                                                              pcVar7 = (this->sc).String;
                                                              uVar5 = TArray<FString,_FString>::
                                                                      Reserve(&gameinfo.quitmessages
                                                                              ,1);
                                                              FString::operator=(gameinfo.
                                                  quitmessages.Array + uVar5,pcVar7);
                                                  bVar2 = FScanner::CheckToken(&this->sc,0x2c);
                                                  } while (bVar2);
                                                  }
                                                  else {
                                                    iVar3 = strcasecmp(__s1.Chars,
                                                                       "menufontcolor_title");
                                                    if (iVar3 == 0) {
                                                      FScanner::MustGetToken(&this->sc,0x102);
                                                      gameinfo.mTitleColor.Index =
                                                           FName::NameManager::FindName
                                                                     (&FName::NameData,
                                                                      (this->sc).String,false);
                                                    }
                                                    else {
                                                      iVar3 = strcasecmp(__s1.Chars,
                                                                         "menufontcolor_label");
                                                      if (iVar3 == 0) {
                                                        FScanner::MustGetToken(&this->sc,0x102);
                                                        gameinfo.mFontColor.Index =
                                                             FName::NameManager::FindName
                                                                       (&FName::NameData,
                                                                        (this->sc).String,false);
                                                      }
                                                      else {
                                                        iVar3 = strcasecmp(__s1.Chars,
                                                                           "menufontcolor_value");
                                                        if (iVar3 == 0) {
                                                          FScanner::MustGetToken(&this->sc,0x102);
                                                          gameinfo.mFontColorValue.Index =
                                                               FName::NameManager::FindName
                                                                         (&FName::NameData,
                                                                          (this->sc).String,false);
                                                        }
                                                        else {
                                                          iVar3 = strcasecmp(__s1.Chars,
                                                                             "menufontcolor_action")
                                                          ;
                                                          if (iVar3 == 0) {
                                                            FScanner::MustGetToken(&this->sc,0x102);
                                                            gameinfo.mFontColorMore.Index =
                                                                 FName::NameManager::FindName
                                                                           (&FName::NameData,
                                                                            (this->sc).String,false)
                                                            ;
                                                          }
                                                          else {
                                                            iVar3 = strcasecmp(__s1.Chars,
                                                                                                                                                              
                                                  "menufontcolor_header");
                                                  if (iVar3 == 0) {
                                                    FScanner::MustGetToken(&this->sc,0x102);
                                                    gameinfo.mFontColorHeader.Index =
                                                         FName::NameManager::FindName
                                                                   (&FName::NameData,
                                                                    (this->sc).String,false);
                                                  }
                                                  else {
                                                    iVar3 = strcasecmp(__s1.Chars,
                                                                       "menufontcolor_highlight");
                                                    if (iVar3 == 0) {
                                                      FScanner::MustGetToken(&this->sc,0x102);
                                                      gameinfo.mFontColorHighlight.Index =
                                                           FName::NameManager::FindName
                                                                     (&FName::NameData,
                                                                      (this->sc).String,false);
                                                    }
                                                    else {
                                                      iVar3 = strcasecmp(__s1.Chars,
                                                                         "menufontcolor_selection");
                                                      if (iVar3 == 0) {
                                                        FScanner::MustGetToken(&this->sc,0x102);
                                                        gameinfo.mFontColorSelection.Index =
                                                             FName::NameManager::FindName
                                                                       (&FName::NameData,
                                                                        (this->sc).String,false);
                                                      }
                                                      else {
                                                        iVar3 = strcasecmp(__s1.Chars,
                                                                           "menubackbutton");
                                                        if (iVar3 == 0) {
                                                          FScanner::MustGetToken(&this->sc,0x102);
                                                          this_00 = &gameinfo.mBackButton;
                                                          goto LAB_004bb904;
                                                        }
                                                        iVar3 = strcasecmp(__s1.Chars,"textscreenx")
                                                        ;
                                                        if (iVar3 == 0) {
                                                          FScanner::MustGetNumber(&this->sc);
                                                          gameinfo.TextScreenX = (this->sc).Number;
                                                        }
                                                        else {
                                                          iVar3 = strcasecmp(__s1.Chars,
                                                                             "textscreeny");
                                                          if (iVar3 == 0) {
                                                            FScanner::MustGetNumber(&this->sc);
                                                            gameinfo.TextScreenY = (this->sc).Number
                                                            ;
                                                          }
                                                          else {
                                                            iVar3 = strcasecmp(__s1.Chars,
                                                                               "defaultendsequence")
                                                            ;
                                                            if (iVar3 == 0) {
                                                              FScanner::MustGetToken
                                                                        (&this->sc,0x102);
                                                              gameinfo.DefaultEndSequence.Index =
                                                                   FName::NameManager::FindName
                                                                             (&FName::NameData,
                                                                              (this->sc).String,
                                                                              false);
                                                            }
                                                            else {
                                                              iVar3 = strcasecmp(__s1.Chars,
                                                                                                                                                                  
                                                  "statscreen_mapnamefont");
                                                  if (iVar3 == 0) {
                                                    FScanner::MustGetToken(&this->sc,0x102);
                                                    gameinfo.mStatscreenMapNameFont.fontname.Index =
                                                         FName::NameManager::FindName
                                                                   (&FName::NameData,
                                                                    (this->sc).String,false);
                                                    bVar2 = FScanner::CheckToken(&this->sc,0x2c);
                                                    if (bVar2) {
                                                      FScanner::MustGetToken(&this->sc,0x102);
                                                      gameinfo.mStatscreenMapNameFont.color.Index =
                                                           FName::NameManager::FindName
                                                                     (&FName::NameData,
                                                                      (this->sc).String,false);
                                                    }
                                                    else {
                                                      gameinfo.mStatscreenMapNameFont.color.Index =
                                                           0;
                                                    }
                                                  }
                                                  else {
                                                    iVar3 = strcasecmp(__s1.Chars,
                                                                       "statscreen_finishedfont");
                                                    if (iVar3 == 0) {
                                                      FScanner::MustGetToken(&this->sc,0x102);
                                                      gameinfo.mStatscreenFinishedFont.fontname.
                                                      Index = FName::NameManager::FindName
                                                                        (&FName::NameData,
                                                                         (this->sc).String,false);
                                                      bVar2 = FScanner::CheckToken(&this->sc,0x2c);
                                                      if (bVar2) {
                                                        FScanner::MustGetToken(&this->sc,0x102);
                                                        gameinfo.mStatscreenFinishedFont.color.Index
                                                             = FName::NameManager::FindName
                                                                         (&FName::NameData,
                                                                          (this->sc).String,false);
                                                      }
                                                      else {
                                                        gameinfo.mStatscreenFinishedFont.color.Index
                                                             = 0;
                                                      }
                                                    }
                                                    else {
                                                      iVar3 = strcasecmp(__s1.Chars,
                                                                         "statscreen_enteringfont");
                                                      if (iVar3 == 0) {
                                                        FScanner::MustGetToken(&this->sc,0x102);
                                                        gameinfo.mStatscreenEnteringFont.fontname.
                                                        Index = FName::NameManager::FindName
                                                                          (&FName::NameData,
                                                                           (this->sc).String,false);
                                                        bVar2 = FScanner::CheckToken(&this->sc,0x2c)
                                                        ;
                                                        if (bVar2) {
                                                          FScanner::MustGetToken(&this->sc,0x102);
                                                          gameinfo.mStatscreenEnteringFont.color.
                                                          Index = FName::NameManager::FindName
                                                                            (&FName::NameData,
                                                                             (this->sc).String,false
                                                                            );
                                                        }
                                                        else {
                                                          gameinfo.mStatscreenEnteringFont.color.
                                                          Index = 0;
                                                        }
                                                      }
                                                      else {
                                                        iVar3 = strcasecmp(__s1.Chars,
                                                                                                                                                      
                                                  "statscreen_finishedpatch");
                                                  if (iVar3 == 0) {
                                                    FScanner::MustGetToken(&this->sc,0x102);
                                                    gameinfo.mStatscreenFinishedFont.fontname.Index
                                                         = FName::NameManager::FindName
                                                                     (&FName::NameData,
                                                                      (this->sc).String,false);
                                                    gameinfo.mStatscreenFinishedFont.color.Index = 1
                                                    ;
                                                  }
                                                  else {
                                                    iVar3 = strcasecmp(__s1.Chars,
                                                                       "statscreen_enteringpatch");
                                                    if (iVar3 == 0) {
                                                      FScanner::MustGetToken(&this->sc,0x102);
                                                      gameinfo.mStatscreenEnteringFont.fontname.
                                                      Index = FName::NameManager::FindName
                                                                        (&FName::NameData,
                                                                         (this->sc).String,false);
                                                      gameinfo.mStatscreenEnteringFont.color.Index =
                                                           1;
                                                    }
                                                    else {
                                                      iVar3 = strcasecmp(__s1.Chars,
                                                                         "norandomplayerclass");
                                                      if (iVar3 == 0) {
                                                        bVar2 = FScanner::CheckToken
                                                                          (&this->sc,0x14c);
                                                        if (bVar2) {
                                                          gameinfo.norandomplayerclass = false;
                                                        }
                                                        else {
                                                          FScanner::MustGetToken(&this->sc,0x14b);
                                                          gameinfo.norandomplayerclass = true;
                                                        }
                                                      }
                                                      else {
                                                        iVar3 = strcasecmp(__s1.Chars,
                                                                           "forcekillscripts");
                                                        if (iVar3 == 0) {
                                                          bVar2 = FScanner::CheckToken
                                                                            (&this->sc,0x14c);
                                                          if (bVar2) {
                                                            gameinfo.forcekillscripts = false;
                                                          }
                                                          else {
                                                            FScanner::MustGetToken(&this->sc,0x14b);
                                                            gameinfo.forcekillscripts = true;
                                                          }
                                                        }
                                                        else {
                                                          FScanner::UnGet(&this->sc);
                                                          SkipToNext(this);
                                                        }
                                                      }
                                                    }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  goto LAB_004bb90c;
                                                  }
                                                  FScanner::MustGetToken(&this->sc,0x102);
                                                  this_00 = &gameinfo.statusbar;
                                                  }
                                                  goto LAB_004bb904;
                                                  }
                                                  FScanner::MustGetToken(&this->sc,0x102);
                                                  FString::FString(&local_40,(this->sc).String);
                                                  V_GetColorStringByName((char *)&local_38);
                                                  if (*(int *)(local_38.Chars + -0xc) != 0) {
                                                    FString::operator=(&local_40,&local_38);
                                                  }
                                                  gameinfo.defaultbloodparticlecolor =
                                                       V_GetColorFromString
                                                                 ((DWORD *)0x0,local_40.Chars);
                                                  }
                                                  }
LAB_004bbf86:
                                                  FString::~FString(&local_38);
                                                  FString::~FString(&local_40);
                                                  goto LAB_004bb90c;
                                                  }
                                                  FScanner::MustGetToken(&this->sc,0x102);
                                                  this_00 = &gameinfo.translator;
                                                  }
                                                  goto LAB_004bb904;
                                                  }
                                                  FScanner::MustGetNumber(&this->sc);
                                                  gameinfo.defKickback = (this->sc).Number;
                                                  }
                                                  }
                                                  goto LAB_004bb90c;
                                                }
                                                FScanner::MustGetToken(&this->sc,0x102);
                                                this_00 = &gameinfo.BorderFlat;
                                              }
                                            }
                                            goto LAB_004bb904;
                                          }
                                          if (gameinfo.infoPages.Count != 0) {
                                            gameinfo.infoPages.Count = 0;
                                          }
                                          do {
                                            FScanner::MustGetToken(&this->sc,0x102);
                                            sVar6 = strlen((this->sc).String);
                                            if (8 < sVar6) {
                                              FScanner::ScriptError
                                                        (&this->sc,
                                                                                                                  
                                                  "Value for \'%s\' can not be longer than %d characters."
                                                  ,"infoPages",8);
                                            }
                                            pcVar7 = (this->sc).String;
                                            TArray<FName,_FName>::Grow(&gameinfo.infoPages,1);
                                            uVar8 = (ulong)gameinfo.infoPages.Count;
                                            gameinfo.infoPages.Count = gameinfo.infoPages.Count + 1;
                                            if (gameinfo.infoPages.Count != 0) {
                                              gameinfo.infoPages.Array[uVar8].Index = 0;
                                            }
                                            pFVar1 = gameinfo.infoPages.Array;
                                            iVar3 = FName::NameManager::FindName
                                                              (&FName::NameData,pcVar7,false);
                                            pFVar1[uVar8].Index = iVar3;
                                            bVar2 = FScanner::CheckToken(&this->sc,0x2c);
                                          } while (bVar2);
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                    goto LAB_004bb90c;
                  }
                  FScanner::MustGetToken(&this->sc,0x102);
                  this_00 = &gameinfo.TitlePage;
                }
              }
            }
          }
LAB_004bb904:
          FString::operator=(this_00,(this->sc).String);
        }
      }
LAB_004bb90c:
      FString::~FString(&local_48);
      bVar2 = FScanner::GetToken(&this->sc);
      if (!bVar2) {
        return;
      }
      iVar3 = (this->sc).TokenType;
    }
  }
  return;
}

Assistant:

void FMapInfoParser::ParseGameInfo()
{
	sc.MustGetToken('{');
	while(sc.GetToken())
	{
		if (sc.TokenType == '}') return;

		sc.TokenMustBe(TK_Identifier);
		FString nextKey = sc.String;
		sc.MustGetToken('=');

		if (nextKey.CompareNoCase("weaponslot") == 0)
		{
			sc.MustGetToken(TK_IntConst);
			if (sc.Number < 0 || sc.Number >= 10)
			{
				sc.ScriptError("Weapon slot index must be in range [0..9].\n");
			}
			int i = sc.Number;
			gameinfo.DefaultWeaponSlots[i].Clear();
			sc.MustGetToken(',');
			do
			{
				sc.MustGetString();
				FName val = sc.String;
				gameinfo.DefaultWeaponSlots[i].Push(val);

			}
			while (sc.CheckToken(','));
		}
		else if(nextKey.CompareNoCase("border") == 0)
		{
			staticgameborder_t *b;
			if (sc.CheckToken(TK_Identifier))
			{
				switch(sc.MustMatchString(GameInfoBorders))
				{
					default:
						b = &DoomBorder;
						break;
					case 1:
						b = &HereticBorder;
						break;
					case 2:
						b = &StrifeBorder;
						break;
				}
				gameinfo.Border = *b;
			}
			else
			{
				// border = {size, offset, tr, t, tl, r, l ,br, b, bl};
				FString *graphics[8] = { &gameinfo.Border.tr, &gameinfo.Border.t, &gameinfo.Border.tl, &gameinfo.Border.r, &gameinfo.Border.l, &gameinfo.Border.br, &gameinfo.Border.b, &gameinfo.Border.bl };
				sc.MustGetToken(TK_IntConst);
				gameinfo.Border.offset = sc.Number;
				sc.MustGetToken(',');
				sc.MustGetToken(TK_IntConst);
				gameinfo.Border.size = sc.Number;
				for(int i = 0;i < 8;i++)
				{
					sc.MustGetToken(',');
					sc.MustGetToken(TK_StringConst);
					(*graphics[i]) = sc.String;
				}
			}
		}
		else if(nextKey.CompareNoCase("armoricons") == 0)
		{
			sc.MustGetToken(TK_StringConst);
			gameinfo.ArmorIcon1 = sc.String;
			if (sc.CheckToken(','))
			{
				sc.MustGetToken(TK_FloatConst);
				gameinfo.Armor2Percent = sc.Float;
				sc.MustGetToken(',');
				sc.MustGetToken(TK_StringConst);
				gameinfo.ArmorIcon2 = sc.String;
			}
		}
		else if(nextKey.CompareNoCase("maparrow") == 0)
		{
			sc.MustGetToken(TK_StringConst);
			gameinfo.mMapArrow = sc.String;
			if (sc.CheckToken(','))
			{
				sc.MustGetToken(TK_StringConst);
				gameinfo.mCheatMapArrow = sc.String;
			}
			else gameinfo.mCheatMapArrow = "";
		}
		// Insert valid keys here.
		GAMEINFOKEY_STRING(mCheatKey, "cheatKey")
		GAMEINFOKEY_STRING(mEasyKey, "easyKey")
		GAMEINFOKEY_STRING(TitlePage, "titlePage")
		GAMEINFOKEY_STRINGARRAY(creditPages, "addcreditPage", 8, false)
		GAMEINFOKEY_STRINGARRAY(creditPages, "CreditPage", 8, true)
		GAMEINFOKEY_STRINGARRAY(PlayerClasses, "addplayerclasses", 0, false)
		GAMEINFOKEY_STRINGARRAY(PlayerClasses, "playerclasses", 0, true)
		GAMEINFOKEY_MUSIC(titleMusic, titleOrder, "titleMusic")
		GAMEINFOKEY_FLOAT(titleTime, "titleTime")
		GAMEINFOKEY_FLOAT(advisoryTime, "advisoryTime")
		GAMEINFOKEY_FLOAT(pageTime, "pageTime")
		GAMEINFOKEY_STRING(chatSound, "chatSound")
		GAMEINFOKEY_MUSIC(finaleMusic, finaleOrder, "finaleMusic")
		GAMEINFOKEY_STRING(FinaleFlat, "finaleFlat")
		GAMEINFOKEY_STRINGARRAY(finalePages, "finalePage", 8, true)
		GAMEINFOKEY_STRINGARRAY(infoPages, "addinfoPage", 8, false)
		GAMEINFOKEY_STRINGARRAY(infoPages, "infoPage", 8, true)
		GAMEINFOKEY_STRING(PauseSign, "pausesign")
		GAMEINFOKEY_STRING(quitSound, "quitSound")
		GAMEINFOKEY_STRING(BorderFlat, "borderFlat")
		GAMEINFOKEY_DOUBLE(telefogheight, "telefogheight")
		GAMEINFOKEY_DOUBLE(gibfactor, "gibfactor")
		GAMEINFOKEY_INT(defKickback, "defKickback")
		GAMEINFOKEY_STRING(SkyFlatName, "SkyFlatName")
		GAMEINFOKEY_STRING(translator, "translator")
		GAMEINFOKEY_COLOR(pickupcolor, "pickupcolor")
		GAMEINFOKEY_COLOR(defaultbloodcolor, "defaultbloodcolor")
		GAMEINFOKEY_COLOR(defaultbloodparticlecolor, "defaultbloodparticlecolor")
		GAMEINFOKEY_STRING(backpacktype, "backpacktype")
		GAMEINFOKEY_STRING(statusbar, "statusbar")
		GAMEINFOKEY_MUSIC(intermissionMusic, intermissionOrder, "intermissionMusic")
		GAMEINFOKEY_STRING(CursorPic, "CursorPic")
		GAMEINFOKEY_BOOL(noloopfinalemusic, "noloopfinalemusic")
		GAMEINFOKEY_BOOL(drawreadthis, "drawreadthis")
		GAMEINFOKEY_BOOL(swapmenu, "swapmenu")
		GAMEINFOKEY_BOOL(dontcrunchcorpses, "dontcrunchcorpses")
		GAMEINFOKEY_BOOL(intermissioncounter, "intermissioncounter")
		GAMEINFOKEY_BOOL(nightmarefast, "nightmarefast")
		GAMEINFOKEY_COLOR(dimcolor, "dimcolor")
		GAMEINFOKEY_FLOAT(dimamount, "dimamount")
		GAMEINFOKEY_INT(definventorymaxamount, "definventorymaxamount")
		GAMEINFOKEY_INT(defaultrespawntime, "defaultrespawntime")
		GAMEINFOKEY_INT(defaultrespawntime, "defaultrespawntime")
		GAMEINFOKEY_INT(defaultdropstyle, "defaultdropstyle")
		GAMEINFOKEY_STRING(Endoom, "endoom")
		GAMEINFOKEY_STRINGARRAY(quitmessages, "addquitmessages", 0, false)
		GAMEINFOKEY_STRINGARRAY(quitmessages, "quitmessages", 0, true)
		GAMEINFOKEY_STRING(mTitleColor, "menufontcolor_title")
		GAMEINFOKEY_STRING(mFontColor, "menufontcolor_label")
		GAMEINFOKEY_STRING(mFontColorValue, "menufontcolor_value")
		GAMEINFOKEY_STRING(mFontColorMore, "menufontcolor_action")
		GAMEINFOKEY_STRING(mFontColorHeader, "menufontcolor_header")
		GAMEINFOKEY_STRING(mFontColorHighlight, "menufontcolor_highlight")
		GAMEINFOKEY_STRING(mFontColorSelection, "menufontcolor_selection")
		GAMEINFOKEY_STRING(mBackButton, "menubackbutton")
		GAMEINFOKEY_INT(TextScreenX, "textscreenx")
		GAMEINFOKEY_INT(TextScreenY, "textscreeny")
		GAMEINFOKEY_STRING(DefaultEndSequence, "defaultendsequence")
		GAMEINFOKEY_FONT(mStatscreenMapNameFont, "statscreen_mapnamefont")
		GAMEINFOKEY_FONT(mStatscreenFinishedFont, "statscreen_finishedfont")
		GAMEINFOKEY_FONT(mStatscreenEnteringFont, "statscreen_enteringfont")
		GAMEINFOKEY_PATCH(mStatscreenFinishedFont, "statscreen_finishedpatch")
		GAMEINFOKEY_PATCH(mStatscreenEnteringFont, "statscreen_enteringpatch")
		GAMEINFOKEY_BOOL(norandomplayerclass, "norandomplayerclass")
		GAMEINFOKEY_BOOL(forcekillscripts, "forcekillscripts") // [JM] Force kill scripts on thing death. (MF7_NOKILLSCRIPTS overrides.)

		else
		{
			// ignore unkown keys.
			sc.UnGet();
			SkipToNext();
		}
	}